

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_flattened_struct_member
          (CompilerGLSL *this,string *basename,SPIRType *type,uint32_t index)

{
  undefined4 in_register_0000000c;
  undefined1 local_50 [44];
  uint32_t index_local;
  SPIRType *type_local;
  string *basename_local;
  CompilerGLSL *this_local;
  string *ret;
  
  register0x00000008 = (Variant *)CONCAT44(in_register_0000000c,index);
  local_50[0x23] = 0;
  type_local = type;
  basename_local = basename;
  this_local = this;
  to_member_name_abi_cxx11_((CompilerGLSL *)local_50,(SPIRType *)basename,index);
  join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
            ((spirv_cross *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type,
             (char (*) [2])0x4e3b4c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  ::std::__cxx11::string::~string((string *)local_50);
  ParsedIR::sanitize_underscores((string *)this);
  return this;
}

Assistant:

string CompilerGLSL::to_flattened_struct_member(const string &basename, const SPIRType &type, uint32_t index)
{
	auto ret = join(basename, "_", to_member_name(type, index));
	ParsedIR::sanitize_underscores(ret);
	return ret;
}